

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe31At7(uint8_t *buf)

{
  return (ulong)(((*(ushort *)(buf + 3) & 0x3fff) << 0x11 | (uint)buf[2] << 9) + (uint)buf[1] * 2 |
                (uint)(*buf >> 7));
}

Assistant:

std::uint64_t readFlUIntLe31At7(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 1;
    res |= (buf[0] >> 7);
    res &= UINT64_C(0x7fffffff);
    return res;
}